

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O0

void __thiscall TPZPrInteg<TPZIntCube3D>::TPZPrInteg(TPZPrInteg<TPZIntCube3D> *this,int order)

{
  TPZGaussRule *pTVar1;
  int in_ESI;
  undefined8 *in_RDI;
  int in_stack_00000018;
  int in_stack_0000001c;
  TPZIntRuleList *in_stack_00000020;
  int in_stack_ffffffffffffffcc;
  TPZIntCube3D *in_stack_ffffffffffffffd0;
  
  TPZIntCube3D::TPZIntCube3D(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  *in_RDI = &PTR__TPZPrInteg_023dc690;
  if (in_ESI < 1) {
    *(undefined4 *)(in_RDI + 6) = 0;
    in_RDI[7] = 0;
  }
  else {
    pTVar1 = TPZIntRuleList::GetRule(in_stack_00000020,in_stack_0000001c,in_stack_00000018);
    in_RDI[7] = pTVar1;
    *(int *)(in_RDI + 6) = in_ESI;
  }
  return;
}

Assistant:

TPZPrInteg(int order) : TFather(order)
    {
		if(order>0)
		{
			fIntP   = TPZIntRuleList::gIntRuleList.GetRule(order);
			fOrdKsi = order;
		}
		else
		{
			fOrdKsi = 0;
			fIntP = 0;
		}
    }